

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keylog.c
# Opt level: O0

void Curl_tls_keylog_open(void)

{
  int iVar1;
  char *__filename;
  char *keylog_file_name;
  
  if ((keylog_file_fp == (FILE *)0x0) &&
     (__filename = curl_getenv("SSLKEYLOGFILE"), __filename != (char *)0x0)) {
    keylog_file_fp = (FILE *)fopen64(__filename,"a");
    if (((FILE *)keylog_file_fp != (FILE *)0x0) &&
       (iVar1 = setvbuf((FILE *)keylog_file_fp,(char *)0x0,1,0x1000), iVar1 != 0)) {
      fclose((FILE *)keylog_file_fp);
      keylog_file_fp = (FILE *)0x0;
    }
    (*Curl_cfree)(__filename);
  }
  return;
}

Assistant:

void
Curl_tls_keylog_open(void)
{
  char *keylog_file_name;

  if(!keylog_file_fp) {
    keylog_file_name = curl_getenv("SSLKEYLOGFILE");
    if(keylog_file_name) {
      keylog_file_fp = fopen(keylog_file_name, FOPEN_APPENDTEXT);
      if(keylog_file_fp) {
#ifdef WIN32
        if(setvbuf(keylog_file_fp, NULL, _IONBF, 0))
#else
        if(setvbuf(keylog_file_fp, NULL, _IOLBF, 4096))
#endif
        {
          fclose(keylog_file_fp);
          keylog_file_fp = NULL;
        }
      }
      Curl_safefree(keylog_file_name);
    }
  }
}